

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

double __thiscall
ProbabEstimator::getProbabLtFast1
          (ProbabEstimator *this,double maxValInReplaced,int numReplaced,int pathLength)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [64];
  double dVar14;
  double vals [20];
  double adStack_c8 [4];
  long alStack_a8 [19];
  
  adStack_c8[1] = 5.29834022337569e-318;
  dVar11 = DistribFunction::getDistrib(this->distribFunction,maxValInReplaced);
  dVar6 = 1.0;
  adStack_c8[2] = 1.0;
  uVar3 = (ulong)(uint)numReplaced;
  if (0 < numReplaced) {
    dVar12 = 1.0;
    uVar2 = 0;
    iVar4 = pathLength;
    do {
      dVar14 = (double)iVar4;
      adStack_c8[uVar2 + 2] = dVar12;
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + -1;
      dVar12 = (dVar12 * dVar14) / (double)(int)uVar2;
    } while (uVar3 != uVar2);
    if (numReplaced != 1) {
      uVar2 = 1;
      dVar12 = 1.0 - dVar11;
      do {
        dVar14 = dVar12 * adStack_c8[uVar2 + 2];
        dVar12 = dVar12 * (1.0 - dVar11);
        adStack_c8[uVar2 + 2] = dVar14;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
  }
  uVar5 = (pathLength - numReplaced) + 1;
  if (uVar5 != 0) {
    dVar6 = 1.0;
    dVar12 = dVar11;
    do {
      dVar14 = dVar12 * dVar6;
      dVar12 = dVar12 * dVar12;
      dVar6 = (double)((ulong)((byte)uVar5 & 1) * (long)dVar14 +
                      (ulong)!(bool)((byte)uVar5 & 1) * (long)dVar6);
      bVar1 = 1 < uVar5;
      uVar5 = (int)uVar5 >> 1;
    } while (bVar1);
  }
  dVar12 = 0.0;
  if (0 < numReplaced) {
    uVar3 = uVar3 + 1;
    do {
      dVar14 = dVar6 * adStack_c8[uVar3];
      dVar6 = dVar6 * dVar11;
      adStack_c8[uVar3] = dVar14;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    if (0 < numReplaced) {
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar9 = vpbroadcastq_avx512f();
      uVar3 = 0;
      auVar10 = ZEXT1664(ZEXT816(0));
      do {
        auVar13 = auVar10;
        auVar10 = vpbroadcastq_avx512f();
        auVar10 = vporq_avx512f(auVar10,auVar8);
        uVar2 = vpcmpuq_avx512f(auVar10,auVar9,2);
        auVar10._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * alStack_a8[uVar3 - 1];
        auVar10._0_8_ = (ulong)((byte)uVar2 & 1) * (long)adStack_c8[uVar3 + 2];
        auVar10._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * alStack_a8[uVar3];
        auVar10._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * alStack_a8[uVar3 + 1];
        auVar10._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * alStack_a8[uVar3 + 2];
        auVar10._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * alStack_a8[uVar3 + 3];
        auVar10._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * alStack_a8[uVar3 + 4];
        auVar10._56_8_ = (uVar2 >> 7) * alStack_a8[uVar3 + 5];
        uVar3 = uVar3 + 8;
        auVar10 = vaddpd_avx512f(auVar10,auVar13);
      } while ((numReplaced + 7U & 0xfffffff8) != uVar3);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar8._0_8_ = (ulong)bVar1 * auVar10._0_8_ | (ulong)!bVar1 * auVar13._0_8_;
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar8._8_8_ = (ulong)bVar1 * auVar10._8_8_ | (ulong)!bVar1 * auVar13._8_8_;
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar8._16_8_ = (ulong)bVar1 * auVar10._16_8_ | (ulong)!bVar1 * auVar13._16_8_;
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar8._24_8_ = (ulong)bVar1 * auVar10._24_8_ | (ulong)!bVar1 * auVar13._24_8_;
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar8._32_8_ = (ulong)bVar1 * auVar10._32_8_ | (ulong)!bVar1 * auVar13._32_8_;
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar8._40_8_ = (ulong)bVar1 * auVar10._40_8_ | (ulong)!bVar1 * auVar13._40_8_;
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar8._48_8_ = (ulong)bVar1 * auVar10._48_8_ | (ulong)!bVar1 * auVar13._48_8_;
      auVar8._56_8_ = (uVar2 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar2 >> 7,0) * auVar13._56_8_;
      auVar7 = vextractf64x4_avx512f(auVar8,1);
      auVar10 = vaddpd_avx512f(auVar8,ZEXT3264(auVar7));
      dVar12 = auVar10._0_8_ + auVar10._16_8_ + auVar10._8_8_ + auVar10._24_8_;
    }
  }
  return dVar12;
}

Assistant:

double ProbabEstimator::getProbabLtFast1( const double maxValInReplaced, const int numReplaced, const int pathLength ){
    double  PAr1 = distribFunction->getDistrib( maxValInReplaced );
    double cPAr1 = 1.0-PAr1;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i < numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr1; 
    for ( int i = 1; i < numReplaced; ++i ){ vals[i] *= val; val *= cPAr1; }
    val = pown( PAr1, pathLength-numReplaced+1 );
    for ( int i = numReplaced-1; i >= 0; --i ){ vals[i] *= val; val *= PAr1; }
    val = 0.0;
    for ( int i = 0; i < numReplaced; ++i ) val += vals[i];
    return val;
}